

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

_sampler_type gl4cts::TextureViewUtilities::getSamplerTypeForInternalformat(GLenum internalformat)

{
  TestError *this;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = internalformat - 0x8229;
  if (uVar1 < 0x14) {
    if ((char)(1 << ((byte)uVar1 & 0x1f)) != '\0') {
      return SAMPLER_TYPE_FLOAT;
    }
    if ((0x55500U >> (uVar1 & 0x1f) & 1) != 0) {
      return SAMPLER_TYPE_SIGNED_INTEGER;
    }
  }
  else {
    uVar2 = (ulong)(internalformat - 0x8d62);
    if (internalformat - 0x8d62 < 0x2e) {
      if ((0xc30c000UL >> (uVar2 & 0x3f) & 1) != 0) {
        return SAMPLER_TYPE_UNSIGNED_INTEGER;
      }
      if ((0x30c300000000U >> (uVar2 & 0x3f) & 1) != 0) {
        return SAMPLER_TYPE_SIGNED_INTEGER;
      }
      if (uVar2 == 0) {
        return SAMPLER_TYPE_FLOAT;
      }
    }
    if (internalformat - 0x8f94 < 8) {
      return SAMPLER_TYPE_FLOAT;
    }
    if ((internalformat - 0x8051 < 0xb) && ((0x5e9U >> (internalformat - 0x8051 & 0x1f) & 1) != 0))
    {
      return SAMPLER_TYPE_FLOAT;
    }
    if ((internalformat - 0x8814 < 8) && ((0xc3U >> (internalformat - 0x8814 & 0x1f) & 1) != 0)) {
      return SAMPLER_TYPE_FLOAT;
    }
    if ((internalformat - 0x8c3a < 10) && ((0x289U >> (internalformat - 0x8c3a & 0x1f) & 1) != 0)) {
      return SAMPLER_TYPE_FLOAT;
    }
    if (internalformat - 0x8dbb < 4) {
      return SAMPLER_TYPE_FLOAT;
    }
    if (internalformat - 0x8e8c < 4) {
      return SAMPLER_TYPE_FLOAT;
    }
    if (internalformat - 0x81a5 < 2) {
      return SAMPLER_TYPE_FLOAT;
    }
    if (internalformat == 0x8cac) {
      return SAMPLER_TYPE_FLOAT;
    }
    if (internalformat != 0x906f) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized internalformat",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x6ee);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return SAMPLER_TYPE_UNSIGNED_INTEGER;
}

Assistant:

_sampler_type TextureViewUtilities::getSamplerTypeForInternalformat(const glw::GLenum internalformat)
{
	_sampler_type result = SAMPLER_TYPE_UNDEFINED;

	/* Compressed internalformats not supported at the moment */

	switch (internalformat)
	{
	case GL_COMPRESSED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32F:
	case GL_RGBA16:
	case GL_RGBA16_SNORM:
	case GL_RGBA16F:
	case GL_RGBA32F:
	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_RGB10_A2:
	case GL_RGB16:
	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB32F:
	case GL_RGB5_A1:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB9_E5:
	case GL_RG16:
	case GL_RG16_SNORM:
	case GL_RG16F:
	case GL_RG32F:
	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_R11F_G11F_B10F:
	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8:
	case GL_R8_SNORM:
	case GL_SRGB8_ALPHA8:
	case GL_SRGB8:
	{
		result = SAMPLER_TYPE_FLOAT;

		break;
	}

	case GL_RGB10_A2UI:
	case GL_RGBA32UI:
	case GL_RGBA16UI:
	case GL_RGBA8UI:
	case GL_RGB16UI:
	case GL_RGB32UI:
	case GL_RGB8UI:
	case GL_RG16UI:
	case GL_RG32UI:
	case GL_RG8UI:
	case GL_R16UI:
	case GL_R32UI:
	case GL_R8UI:
	{
		result = SAMPLER_TYPE_UNSIGNED_INTEGER;

		break;
	}

	case GL_RGBA16I:
	case GL_RGBA32I:
	case GL_RGBA8I:
	case GL_RGB16I:
	case GL_RGB32I:
	case GL_RGB8I:
	case GL_RG16I:
	case GL_RG32I:
	case GL_RG8I:
	case GL_R16I:
	case GL_R32I:
	case GL_R8I:
	{
		result = SAMPLER_TYPE_SIGNED_INTEGER;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}